

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# borromean_impl.h
# Opt level: O0

int secp256k1_borromean_verify
              (secp256k1_ecmult_context *ecmult_ctx,secp256k1_scalar *evalues,uchar *e0,
              secp256k1_scalar *s,secp256k1_gej *pubs,size_t *rsizes,size_t nrings,uchar *m,
              size_t mlen)

{
  int iVar1;
  secp256k1_scalar *psVar2;
  int local_1ec;
  size_t sStack_1e8;
  int overflow;
  size_t size;
  size_t count;
  size_t j;
  size_t i;
  uchar tmp [33];
  secp256k1_sha256 sha256_e0;
  secp256k1_scalar ens;
  secp256k1_ge rge;
  secp256k1_gej rgej;
  size_t *rsizes_local;
  secp256k1_gej *pubs_local;
  secp256k1_scalar *s_local;
  uchar *e0_local;
  secp256k1_scalar *evalues_local;
  secp256k1_ecmult_context *ecmult_ctx_local;
  
  size = 0;
  secp256k1_sha256_initialize((secp256k1_sha256 *)(tmp + 0x20));
  j = 0;
  do {
    if (nrings <= j) {
      secp256k1_sha256_write((secp256k1_sha256 *)(tmp + 0x20),m,mlen);
      secp256k1_sha256_finalize((secp256k1_sha256 *)(tmp + 0x20),(uchar *)&i);
      iVar1 = memcmp(e0,&i,0x20);
      return (uint)(iVar1 == 0);
    }
    secp256k1_borromean_hash((uchar *)&i,m,mlen,e0,0x20,j,0);
    secp256k1_scalar_set_b32((secp256k1_scalar *)&sha256_e0.bytes,(uchar *)&i,&local_1ec);
    for (count = 0; count < rsizes[j]; count = count + 1) {
      if ((((local_1ec != 0) || (iVar1 = secp256k1_scalar_is_zero(s + size), iVar1 != 0)) ||
          (iVar1 = secp256k1_scalar_is_zero((secp256k1_scalar *)&sha256_e0.bytes), iVar1 != 0)) ||
         (iVar1 = secp256k1_gej_is_infinity(pubs + size), iVar1 != 0)) {
        return 0;
      }
      if (evalues != (secp256k1_scalar *)0x0) {
        psVar2 = evalues + size;
        psVar2->d[0] = sha256_e0.bytes;
        psVar2->d[1] = ens.d[0];
        psVar2->d[2] = ens.d[1];
        psVar2->d[3] = ens.d[2];
      }
      secp256k1_ecmult(ecmult_ctx,(secp256k1_gej *)&rge.infinity,pubs + size,
                       (secp256k1_scalar *)&sha256_e0.bytes,s + size);
      iVar1 = secp256k1_gej_is_infinity((secp256k1_gej *)&rge.infinity);
      if (iVar1 != 0) {
        return 0;
      }
      secp256k1_ge_set_gej_var((secp256k1_ge *)(ens.d + 3),(secp256k1_gej *)&rge.infinity);
      secp256k1_eckey_pubkey_serialize
                ((secp256k1_ge *)(ens.d + 3),(uchar *)&i,&stack0xfffffffffffffe18,1);
      if (count == rsizes[j] - 1) {
        secp256k1_sha256_write((secp256k1_sha256 *)(tmp + 0x20),(uchar *)&i,sStack_1e8);
      }
      else {
        secp256k1_borromean_hash((uchar *)&i,m,mlen,(uchar *)&i,0x21,j,count + 1);
        secp256k1_scalar_set_b32((secp256k1_scalar *)&sha256_e0.bytes,(uchar *)&i,&local_1ec);
      }
      size = size + 1;
    }
    j = j + 1;
  } while( true );
}

Assistant:

int secp256k1_borromean_verify(const secp256k1_ecmult_context* ecmult_ctx, secp256k1_scalar *evalues, const unsigned char *e0,
 const secp256k1_scalar *s, const secp256k1_gej *pubs, const size_t *rsizes, size_t nrings, const unsigned char *m, size_t mlen) {
    secp256k1_gej rgej;
    secp256k1_ge rge;
    secp256k1_scalar ens;
    secp256k1_sha256 sha256_e0;
    unsigned char tmp[33];
    size_t i;
    size_t j;
    size_t count;
    size_t size;
    int overflow;
    VERIFY_CHECK(ecmult_ctx != NULL);
    VERIFY_CHECK(e0 != NULL);
    VERIFY_CHECK(s != NULL);
    VERIFY_CHECK(pubs != NULL);
    VERIFY_CHECK(rsizes != NULL);
    VERIFY_CHECK(nrings > 0);
    VERIFY_CHECK(m != NULL);
    count = 0;
    secp256k1_sha256_initialize(&sha256_e0);
    for (i = 0; i < nrings; i++) {
        VERIFY_CHECK(INT_MAX - count > rsizes[i]);
        secp256k1_borromean_hash(tmp, m, mlen, e0, 32, i, 0);
        secp256k1_scalar_set_b32(&ens, tmp, &overflow);
        for (j = 0; j < rsizes[i]; j++) {
            if (overflow || secp256k1_scalar_is_zero(&s[count]) || secp256k1_scalar_is_zero(&ens) || secp256k1_gej_is_infinity(&pubs[count])) {
                return 0;
            }
            if (evalues) {
                /*If requested, save the challenges for proof rewind.*/
                evalues[count] = ens;
            }
            secp256k1_ecmult(ecmult_ctx, &rgej, &pubs[count], &ens, &s[count]);
            if (secp256k1_gej_is_infinity(&rgej)) {
                return 0;
            }
            /* OPT: loop can be hoisted and split to use batch inversion across all the rings; this would make it much faster. */
            secp256k1_ge_set_gej_var(&rge, &rgej);
            secp256k1_eckey_pubkey_serialize(&rge, tmp, &size, 1);
            if (j != rsizes[i] - 1) {
                secp256k1_borromean_hash(tmp, m, mlen, tmp, 33, i, j + 1);
                secp256k1_scalar_set_b32(&ens, tmp, &overflow);
            } else {
                secp256k1_sha256_write(&sha256_e0, tmp, size);
            }
            count++;
        }
    }
    secp256k1_sha256_write(&sha256_e0, m, mlen);
    secp256k1_sha256_finalize(&sha256_e0, tmp);
    return memcmp(e0, tmp, 32) == 0;
}